

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
          (cmCPackPropertiesGenerator *this,cmLocalGenerator *lg,cmInstalledFile *installedFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations)

{
  allocator<char> local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CPACK_BUILD_CONFIG",&local_59);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,configurations);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_40,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmScriptGenerator_00993f10;
  this->LG = lg;
  this->InstalledFile = installedFile;
  (this->super_cmScriptGenerator).ActionsPerConfig = true;
  return;
}

Assistant:

cmCPackPropertiesGenerator::cmCPackPropertiesGenerator(
  cmLocalGenerator* lg, cmInstalledFile const& installedFile,
  std::vector<std::string> const& configurations)
  : cmScriptGenerator("CPACK_BUILD_CONFIG", configurations)
  , LG(lg)
  , InstalledFile(installedFile)
{
  this->ActionsPerConfig = true;
}